

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O0

int main(void)

{
  IPersonListener local_68;
  BadListener bl;
  ConsoleListener cr;
  Person p;
  
  Person::Person((Person *)&cr,10);
  ConsoleListener::ConsoleListener((ConsoleListener *)&bl.super_IPersonListener);
  BadListener::BadListener((BadListener *)&local_68);
  Person::subscribe((Person *)&cr,&bl.super_IPersonListener);
  Person::set_age((Person *)&cr,0xb);
  Person::set_age((Person *)&cr,0xc);
  Person::subscribe((Person *)&cr,&local_68);
  Person::set_age((Person *)&cr,0xd);
  Person::unsubscribe((Person *)&cr,&bl.super_IPersonListener);
  Person::set_age((Person *)&cr,0x11);
  BadListener::~BadListener((BadListener *)&local_68);
  ConsoleListener::~ConsoleListener((ConsoleListener *)&bl);
  Person::~Person((Person *)&cr);
  return 0;
}

Assistant:

int main()
{
	Person p(10);
	ConsoleListener cr;
	BadListener bl;
	p.subscribe(std::addressof(cr));
	p.set_age(11);
	p.set_age(12);
	p.subscribe(std::addressof(bl));
	p.set_age(13);
	p.unsubscribe(std::addressof(cr));
	p.set_age(17);

	return 0;
}